

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceReadOverclockState
          (zes_device_handle_t hDevice,zes_overclock_mode_t *pOverclockMode,
          ze_bool_t *pWaiverSetting,ze_bool_t *pOverclockState,zes_pending_action_t *pPendingAction,
          ze_bool_t *pPendingReset)

{
  zes_pfnDeviceReadOverclockState_t pfnReadOverclockState;
  ze_result_t result;
  ze_bool_t *pPendingReset_local;
  zes_pending_action_t *pPendingAction_local;
  ze_bool_t *pOverclockState_local;
  ze_bool_t *pWaiverSetting_local;
  zes_overclock_mode_t *pOverclockMode_local;
  zes_device_handle_t hDevice_local;
  
  pfnReadOverclockState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cad0 != (code *)0x0) {
    pfnReadOverclockState._4_4_ =
         (*DAT_0011cad0)(hDevice,pOverclockMode,pWaiverSetting,pOverclockState,pPendingAction,
                         pPendingReset);
  }
  return pfnReadOverclockState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceReadOverclockState(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        zes_overclock_mode_t* pOverclockMode,           ///< [out] One of overclock mode.
        ze_bool_t* pWaiverSetting,                      ///< [out] Waiver setting: 0 = Waiver not set, 1 = waiver has been set.
        ze_bool_t* pOverclockState,                     ///< [out] Current settings 0 =manufacturing state, 1= shipped state)..
        zes_pending_action_t* pPendingAction,           ///< [out] This enum is returned when the driver attempts to set an
                                                        ///< overclock control or reset overclock settings.
        ze_bool_t* pPendingReset                        ///< [out] Pending reset 0 =manufacturing state, 1= shipped state)..
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReadOverclockState = context.zesDdiTable.Device.pfnReadOverclockState;
        if( nullptr != pfnReadOverclockState )
        {
            result = pfnReadOverclockState( hDevice, pOverclockMode, pWaiverSetting, pOverclockState, pPendingAction, pPendingReset );
        }
        else
        {
            // generic implementation
        }

        return result;
    }